

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O3

Gia_Man_t *
Gia_ManCorrSpecReduce(Gia_Man_t *p,int nFrames,int fScorr,Vec_Int_t **pvOutputs,int fRings)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int *piVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  Gia_Man_t *pGVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  Gia_Obj_t *pGVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  
  if (nFrames < 1) {
    __assert_fail("nFrames > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                  ,0x70,"Gia_Man_t *Gia_ManCorrSpecReduce(Gia_Man_t *, int, int, Vec_Int_t **, int)"
                 );
  }
  if (p->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                  ,0x71,"Gia_Man_t *Gia_ManCorrSpecReduce(Gia_Man_t *, int, int, Vec_Int_t **, int)"
                 );
  }
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pReprs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                  ,0x72,"Gia_Man_t *Gia_ManCorrSpecReduce(Gia_Man_t *, int, int, Vec_Int_t **, int)"
                 );
  }
  iVar15 = fScorr + nFrames;
  uVar16 = (long)iVar15 * (long)p->nObjs;
  iVar22 = (int)uVar16;
  if ((p->vCopies).nCap < iVar22) {
    piVar8 = (p->vCopies).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc(uVar16 * 4);
    }
    else {
      piVar8 = (int *)realloc(piVar8,uVar16 * 4);
    }
    (p->vCopies).pArray = piVar8;
    if (piVar8 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = iVar22;
  }
  if (0 < iVar22) {
    memset((p->vCopies).pArray,0xff,(uVar16 & 0xffffffff) << 2);
  }
  (p->vCopies).nSize = iVar22;
  Gia_ManSetPhase(p);
  p_00 = Gia_ManStart(p->nObjs * nFrames);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar2);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar2);
  }
  p_00->pName = pcVar10;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar2);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar2);
  }
  p_00->pSpec = pcVar10;
  Gia_ManHashAlloc(p_00);
  if (p->nObjs < 1) {
LAB_005cdc6a:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if ((p->vCopies).nSize < 1) {
LAB_005cdca8:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  piVar8 = (p->vCopies).pArray;
  *piVar8 = 0;
  iVar22 = p->nRegs;
  if (0 < iVar22) {
    iVar18 = 0;
    do {
      iVar1 = p->vCis->nSize;
      uVar19 = (iVar1 - iVar22) + iVar18;
      if (((int)uVar19 < 0) || (iVar1 <= (int)uVar19)) goto LAB_005cdcc7;
      iVar1 = p->vCis->pArray[uVar19];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_005cdc89;
      pGVar17 = p->pObjs;
      if (pGVar17 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar16 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar16 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar16 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_00->pObjs;
      if ((pGVar11 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar11)) goto LAB_005cdc6a;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_00->pObjs;
      if ((pGVar11 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar11)) goto LAB_005cdc6a;
      pGVar17 = pGVar17 + iVar1;
      pGVar4 = p->pObjs;
      if ((pGVar17 < pGVar4) || (pGVar4 + p->nObjs <= pGVar17)) goto LAB_005cdc6a;
      uVar19 = (int)((long)pGVar17 - (long)pGVar4 >> 2) * -0x55555555;
      if (((int)uVar19 < 0) || ((p->vCopies).nSize <= (int)uVar19)) goto LAB_005cdca8;
      piVar8 = (p->vCopies).pArray;
      piVar8[uVar19 & 0x7fffffff] = (int)((ulong)((long)pGVar11 - (long)pGVar3) >> 2) * 0x55555556;
      iVar18 = iVar18 + 1;
      iVar22 = p->nRegs;
    } while (iVar18 < iVar22);
    if (0 < iVar22) {
      pVVar12 = p->vCis;
      iVar18 = 0;
      do {
        iVar1 = pVVar12->nSize;
        uVar19 = (iVar1 - iVar22) + iVar18;
        if (((int)uVar19 < 0) || (iVar1 <= (int)uVar19)) {
LAB_005cdcc7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar19 = pVVar12->pArray[uVar19];
        lVar20 = (long)(int)uVar19;
        if ((lVar20 < 0) || (p->nObjs <= (int)uVar19)) goto LAB_005cdc89;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        uVar16 = (ulong)(uint)p->pReprs[lVar20] & 0xfffffff;
        if (uVar16 != 0xfffffff) {
          if ((uint)p->nObjs <= (uint)uVar16) goto LAB_005cdc89;
          uVar7 = (p->vCopies).nSize;
          if ((int)uVar7 <= (int)(uint)uVar16) goto LAB_005cdcc7;
          if (uVar7 <= uVar19) goto LAB_005cdca8;
          piVar8[lVar20] = piVar8[uVar16];
          iVar22 = p->nRegs;
        }
        iVar18 = iVar18 + 1;
      } while (iVar18 < iVar22);
    }
  }
  if (0 < iVar15) {
    iVar22 = 0;
    do {
      if (p->nObjs < 1) goto LAB_005cdc6a;
      uVar19 = p->nObjs * iVar22;
      if (((int)uVar19 < 0) || ((p->vCopies).nSize <= (int)uVar19)) goto LAB_005cdca8;
      piVar8[uVar19] = 0;
      pVVar12 = p->vCis;
      uVar16 = (ulong)(uint)pVVar12->nSize;
      if (p->nRegs < pVVar12->nSize) {
        lVar20 = 0;
        do {
          if ((int)uVar16 <= lVar20) goto LAB_005cdcc7;
          iVar18 = pVVar12->pArray[lVar20];
          if (((long)iVar18 < 0) || (p->nObjs <= iVar18)) goto LAB_005cdc89;
          pGVar17 = p->pObjs;
          if (pGVar17 == (Gia_Obj_t *)0x0) break;
          pGVar11 = Gia_ManAppendObj(p_00);
          uVar16 = *(ulong *)pGVar11;
          *(ulong *)pGVar11 = uVar16 | 0x9fffffff;
          *(ulong *)pGVar11 =
               uVar16 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar3 = p_00->pObjs;
          if ((pGVar11 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar11)) goto LAB_005cdc6a;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar3) >> 2) * -0x55555555);
          pGVar3 = p_00->pObjs;
          if ((pGVar11 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar11)) goto LAB_005cdc6a;
          pGVar17 = pGVar17 + iVar18;
          pGVar4 = p->pObjs;
          if ((pGVar17 < pGVar4) || (pGVar4 + p->nObjs <= pGVar17)) goto LAB_005cdc6a;
          uVar19 = (int)((ulong)((long)pGVar17 - (long)pGVar4) >> 2) * -0x55555555 +
                   p->nObjs * iVar22;
          if (((int)uVar19 < 0) || ((p->vCopies).nSize <= (int)uVar19)) goto LAB_005cdca8;
          piVar8 = (p->vCopies).pArray;
          piVar8[uVar19] = (int)((ulong)((long)pGVar11 - (long)pGVar3) >> 2) * 0x55555556;
          lVar20 = lVar20 + 1;
          pVVar12 = p->vCis;
          uVar16 = (ulong)pVVar12->nSize;
        } while (lVar20 < (long)(uVar16 - (long)p->nRegs));
      }
      iVar22 = iVar22 + 1;
    } while (iVar22 != iVar15);
  }
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  pVVar12->nCap = 1000;
  pVVar12->nSize = 0;
  piVar8 = (int *)malloc(4000);
  pVVar12->pArray = piVar8;
  *pvOutputs = pVVar12;
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  pVVar12->nCap = 1000;
  pVVar12->nSize = 0;
  piVar8 = (int *)malloc(4000);
  pVVar12->pArray = piVar8;
  uVar19 = p->nObjs;
  uVar16 = (ulong)uVar19;
  if (fRings == 0) {
    if ((int)uVar19 < 2) goto LAB_005cdbc4;
    lVar20 = 1;
    lVar21 = 0xc;
    do {
      uVar14 = (ulong)(uint)p->pReprs[lVar20] & 0xfffffff;
      if (uVar14 != 0xfffffff) {
        if ((uint)uVar16 <= (uint)uVar14) goto LAB_005cdc89;
        pGVar17 = p->pObjs;
        if (pGVar17 != (Gia_Obj_t *)0x0) {
          pGVar3 = pGVar17 + uVar14;
          if ((uint)uVar14 == 0) {
            uVar19 = 0;
          }
          else {
            uVar19 = Gia_ManCorrSpecReal(p_00,p,pGVar3,nFrames,0);
          }
          pGVar11 = (Gia_Obj_t *)(&pGVar17->field_0x0 + lVar21);
          uVar7 = Gia_ManCorrSpecReal(p_00,p,pGVar11,nFrames,0);
          if ((int)uVar7 < 0) goto LAB_005cdce6;
          uVar7 = uVar7 ^ ((uint)((ulong)*(undefined8 *)pGVar3 >> 0x20) ^
                          (uint)((ulong)*(undefined8 *)pGVar11 >> 0x20)) >> 0x1f;
          if (uVar19 != uVar7) {
            pGVar4 = p->pObjs;
            if ((pGVar3 < pGVar4) || (pGVar4 + p->nObjs <= pGVar3)) goto LAB_005cdc6a;
            Vec_IntPush(*pvOutputs,(int)((ulong)((long)pGVar3 - (long)pGVar4) >> 2) * -0x55555555);
            pGVar3 = p->pObjs;
            if ((pGVar11 < pGVar3) || (pGVar3 + p->nObjs <= pGVar11)) goto LAB_005cdc6a;
            Vec_IntPush(*pvOutputs,
                        (int)((ulong)((long)pGVar17 + (lVar21 - (long)pGVar3)) >> 2) * -0x55555555);
            iVar15 = Gia_ManHashXor(p_00,uVar19,uVar7);
            Vec_IntPush(pVVar12,iVar15);
          }
        }
      }
      lVar20 = lVar20 + 1;
      uVar16 = (ulong)p->nObjs;
      lVar21 = lVar21 + 0xc;
    } while (lVar20 < (long)uVar16);
  }
  else {
    if ((int)uVar19 < 2) goto LAB_005cdbc4;
    uVar16 = 1;
    do {
      pGVar17 = p->pObjs + uVar16;
      uVar19 = (uint)p->pReprs[uVar16] & 0xfffffff;
      if (uVar19 == 0xfffffff) {
        if (0 < p->pNexts[uVar16]) {
          uVar14 = uVar16 & 0xffffffff;
          uVar19 = p->pNexts[uVar16];
          do {
            uVar7 = uVar19;
            iVar15 = (int)uVar14;
            if (((p->nObjs <= iVar15) ||
                (uVar19 = Gia_ManCorrSpecReal(p_00,p,p->pObjs + uVar14,nFrames,0), (int)uVar7 < 0))
               || (p->nObjs <= (int)uVar7)) goto LAB_005cdc89;
            uVar5 = Gia_ManCorrSpecReal(p_00,p,p->pObjs + uVar7,nFrames,0);
            if (p->nObjs <= iVar15) goto LAB_005cdc89;
            if ((int)uVar19 < 0) goto LAB_005cdce6;
            if ((uint)p->nObjs <= uVar7) goto LAB_005cdc89;
            if ((int)uVar5 < 0) goto LAB_005cdce6;
            uVar6 = (uint)((ulong)*(undefined8 *)pGVar17 >> 0x20);
            uVar5 = uVar5 ^ ((uint)((ulong)*(undefined8 *)(p->pObjs + uVar7) >> 0x20) ^ uVar6) >>
                            0x1f;
            if (((uVar5 != 1) &&
                (uVar6 = -((int)(uVar6 ^ (uint)((ulong)*(undefined8 *)(p->pObjs + uVar14) >> 0x20))
                          >> 0x1f), uVar19 != uVar6)) && (uVar19 = uVar19 ^ uVar6, uVar19 != uVar5))
            {
              Vec_IntPush(*pvOutputs,iVar15);
              Vec_IntPush(*pvOutputs,uVar7);
              iVar15 = Gia_ManHashAnd(p_00,uVar19,uVar5 ^ 1);
              Vec_IntPush(pVVar12,iVar15);
            }
            uVar14 = (ulong)uVar7;
            uVar19 = p->pNexts[uVar7];
          } while (p->pNexts[uVar7] != 0);
          if ((p->nObjs <= (int)uVar7) ||
             (uVar19 = Gia_ManCorrSpecReal(p_00,p,p->pObjs + uVar7,nFrames,0),
             (long)p->nObjs <= (long)uVar16)) {
LAB_005cdc89:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar5 = Gia_ManCorrSpecReal(p_00,p,p->pObjs + uVar16,nFrames,0);
          if (p->nObjs <= (int)uVar7) goto LAB_005cdc89;
          if ((int)uVar19 < 0) {
LAB_005cdce6:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf5,"int Abc_LitNotCond(int, int)");
          }
          if ((long)p->nObjs <= (long)uVar16) goto LAB_005cdc89;
          if ((int)uVar5 < 0) goto LAB_005cdce6;
          uVar6 = (uint)((ulong)*(undefined8 *)pGVar17 >> 0x20);
          uVar5 = uVar5 ^ ((uint)((ulong)*(undefined8 *)(p->pObjs + uVar16) >> 0x20) ^ uVar6) >>
                          0x1f;
          if (((uVar5 != 1) &&
              (uVar6 = -((int)(uVar6 ^ (uint)((ulong)*(undefined8 *)(p->pObjs + uVar7) >> 0x20)) >>
                        0x1f), uVar19 != uVar6)) && (uVar19 = uVar19 ^ uVar6, uVar19 != uVar5)) {
            Vec_IntPush(*pvOutputs,uVar7);
            Vec_IntPush(*pvOutputs,(int)uVar16);
            uVar19 = Gia_ManHashAnd(p_00,uVar19,uVar5 ^ 1);
            goto LAB_005cd9fa;
          }
        }
      }
      else if (uVar19 == 0) {
        uVar19 = Gia_ManCorrSpecReal(p_00,p,pGVar17,nFrames,0);
        if ((int)uVar19 < 0) goto LAB_005cdce6;
        uVar7 = -(int)((long)*(undefined8 *)pGVar17 >> 0x3f);
        if (uVar19 != uVar7) {
          uVar19 = uVar19 ^ uVar7;
          Vec_IntPush(*pvOutputs,0);
          Vec_IntPush(*pvOutputs,(int)uVar16);
LAB_005cd9fa:
          Vec_IntPush(pVVar12,uVar19);
        }
      }
      uVar16 = uVar16 + 1;
    } while ((long)uVar16 < (long)p->nObjs);
  }
  piVar8 = pVVar12->pArray;
LAB_005cdbc4:
  iVar15 = pVVar12->nSize;
  if (0 < (long)iVar15) {
    lVar20 = 0;
    do {
      Gia_ManAppendCo(p_00,piVar8[lVar20]);
      lVar20 = lVar20 + 1;
    } while (iVar15 != lVar20);
  }
  if (piVar8 != (int *)0x0) {
    free(piVar8);
  }
  free(pVVar12);
  Gia_ManHashStop(p_00);
  piVar8 = (p->vCopies).pArray;
  if (piVar8 != (int *)0x0) {
    free(piVar8);
    (p->vCopies).pArray = (int *)0x0;
  }
  (p->vCopies).nCap = 0;
  (p->vCopies).nSize = 0;
  pGVar13 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar13;
}

Assistant:

Gia_Man_t * Gia_ManCorrSpecReduce( Gia_Man_t * p, int nFrames, int fScorr, Vec_Int_t ** pvOutputs, int fRings )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pRepr;
    Vec_Int_t * vXorLits;
    int f, i, iPrev, iObj, iPrevNew, iObjNew;
    assert( nFrames > 0 );
    assert( Gia_ManRegNum(p) > 0 );
    assert( p->pReprs != NULL );
    Vec_IntFill( &p->vCopies, (nFrames+fScorr)*Gia_ManObjNum(p), -1 );
    Gia_ManSetPhase( p );
    pNew = Gia_ManStart( nFrames * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ObjSetCopyF( p, 0, Gia_ManConst0(p), 0 );
    Gia_ManForEachRo( p, pObj, i )
        Gia_ObjSetCopyF( p, 0, pObj, Gia_ManAppendCi(pNew) );
    Gia_ManForEachRo( p, pObj, i )
        if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
            Gia_ObjSetCopyF( p, 0, pObj, Gia_ObjCopyF(p, 0, pRepr) );
    for ( f = 0; f < nFrames+fScorr; f++ )
    { 
        Gia_ObjSetCopyF( p, f, Gia_ManConst0(p), 0 );
        Gia_ManForEachPi( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ManAppendCi(pNew) );
    }
    *pvOutputs = Vec_IntAlloc( 1000 );
    vXorLits = Vec_IntAlloc( 1000 );
    if ( fRings )
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( Gia_ObjIsConst( p, i ) )
            {
                iObjNew = Gia_ManCorrSpecReal( pNew, p, pObj, nFrames, 0 );
                iObjNew = Abc_LitNotCond( iObjNew, Gia_ObjPhase(pObj) );
                if ( iObjNew != 0 )
                {
                    Vec_IntPush( *pvOutputs, 0 );
                    Vec_IntPush( *pvOutputs, i );
                    Vec_IntPush( vXorLits, iObjNew );
                }
            }
            else if ( Gia_ObjIsHead( p, i ) )
            {
                iPrev = i;
                Gia_ClassForEachObj1( p, i, iObj )
                {
                    iPrevNew = Gia_ManCorrSpecReal( pNew, p, Gia_ManObj(p, iPrev), nFrames, 0 );
                    iObjNew  = Gia_ManCorrSpecReal( pNew, p, Gia_ManObj(p, iObj), nFrames, 0 );
                    iPrevNew = Abc_LitNotCond( iPrevNew, Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iPrev)) );
                    iObjNew  = Abc_LitNotCond( iObjNew,  Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iObj)) );
                    if ( iPrevNew != iObjNew && iPrevNew != 0 && iObjNew != 1 )
                    {
                        Vec_IntPush( *pvOutputs, iPrev );
                        Vec_IntPush( *pvOutputs, iObj );
                        Vec_IntPush( vXorLits, Gia_ManHashAnd(pNew, iPrevNew, Abc_LitNot(iObjNew)) );
                    }
                    iPrev = iObj;
                }
                iObj = i;
                iPrevNew = Gia_ManCorrSpecReal( pNew, p, Gia_ManObj(p, iPrev), nFrames, 0 );
                iObjNew  = Gia_ManCorrSpecReal( pNew, p, Gia_ManObj(p, iObj), nFrames, 0 );
                iPrevNew = Abc_LitNotCond( iPrevNew, Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iPrev)) );
                iObjNew  = Abc_LitNotCond( iObjNew,  Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iObj)) );
                if ( iPrevNew != iObjNew && iPrevNew != 0 && iObjNew != 1 )
                {
                    Vec_IntPush( *pvOutputs, iPrev );
                    Vec_IntPush( *pvOutputs, iObj );
                    Vec_IntPush( vXorLits, Gia_ManHashAnd(pNew, iPrevNew, Abc_LitNot(iObjNew)) );
                }
            }
        }
    }
    else
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
            if ( pRepr == NULL )
                continue;
            iPrevNew = Gia_ObjIsConst(p, i)? 0 : Gia_ManCorrSpecReal( pNew, p, pRepr, nFrames, 0 );
            iObjNew  = Gia_ManCorrSpecReal( pNew, p, pObj, nFrames, 0 );
            iObjNew  = Abc_LitNotCond( iObjNew, Gia_ObjPhase(pRepr) ^ Gia_ObjPhase(pObj) );
            if ( iPrevNew != iObjNew )
            {
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pRepr) );
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pObj) );
                Vec_IntPush( vXorLits, Gia_ManHashXor(pNew, iPrevNew, iObjNew) );
            }
        }
    }
    Vec_IntForEachEntry( vXorLits, iObjNew, i )
        Gia_ManAppendCo( pNew, iObjNew );
    Vec_IntFree( vXorLits );
    Gia_ManHashStop( pNew );
    Vec_IntErase( &p->vCopies );
//Abc_Print( 1, "Before sweeping = %d\n", Gia_ManAndNum(pNew) );
    pNew = Gia_ManCleanup( pTemp = pNew );
//Abc_Print( 1, "After sweeping = %d\n", Gia_ManAndNum(pNew) );
    Gia_ManStop( pTemp );
    return pNew;
}